

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlFeatureDefn::DebugXmlFeatures(GdlFeatureDefn *this,ofstream *strmOut,string *staPathToCur)

{
  pointer ppGVar1;
  GdlFeatureSetting *this_00;
  ostream *poVar2;
  uint uVar3;
  char rgch [5];
  string staT;
  GrpLineAndFile lnf;
  allocator local_be;
  char local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  string local_b8;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  GrpLineAndFile::GrpLineAndFile
            ((GrpLineAndFile *)local_98,&(this->super_GdlDefn).super_GdlObject.m_lnf);
  uVar3 = this->m_nID;
  poVar2 = std::operator<<((ostream *)strmOut,"    <feature name=\"");
  std::__cxx11::string::string((string *)&local_b8,(string *)&this->m_staName);
  poVar2 = std::operator<<(poVar2,(string *)&local_b8);
  poVar2 = std::operator<<(poVar2,"\" featureID=\"");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::string::~string((string *)&local_b8);
  if (0xffffff < uVar3) {
    local_b9 = 0;
    local_ba = (undefined1)uVar3;
    local_bb = (undefined1)(uVar3 >> 8);
    local_bc = (undefined1)(uVar3 >> 0x10);
    local_bd = (char)(uVar3 >> 0x18);
    std::__cxx11::string::string((string *)&local_b8,&local_bd,&local_be);
    poVar2 = std::operator<<((ostream *)strmOut,"\" featureIDstring=\"");
    std::operator<<(poVar2,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  poVar2 = std::operator<<((ostream *)strmOut,"\" index=\"");
  std::ostream::operator<<(poVar2,this->m_nInternalID);
  if ((local_98._0_4_ != -1) && (this->m_nID != 1)) {
    poVar2 = std::operator<<((ostream *)strmOut,"\" inFile=\"");
    std::__cxx11::string::string((string *)&local_70,(string *)staPathToCur);
    GrpLineAndFile::FileWithPath(&local_b8,(GrpLineAndFile *)local_98,&local_70);
    poVar2 = std::operator<<(poVar2,(string *)&local_b8);
    poVar2 = std::operator<<(poVar2,"\" atLine=\"");
    std::ostream::operator<<(poVar2,local_98._4_4_);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::operator<<((ostream *)strmOut,"\" >\n");
  uVar3 = 0;
  while( true ) {
    ppGVar1 = (this->m_vpfset).
              super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpfset).
                      super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <=
        (ulong)uVar3) break;
    this_00 = ppGVar1[uVar3];
    std::__cxx11::string::string((string *)&local_50,(string *)staPathToCur);
    GdlFeatureSetting::DebugXmlFeatures(this_00,strmOut,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = uVar3 + 1;
  }
  std::operator<<((ostream *)strmOut,"    </feature>\n");
  std::__cxx11::string::~string((string *)(local_98 + 8));
  return;
}

Assistant:

void GdlFeatureDefn::DebugXmlFeatures(std::ofstream & strmOut, std::string staPathToCur)
{
	GrpLineAndFile lnf = this->LineAndFile();
	unsigned int nID = this->ID();
	strmOut << "    <feature name=\"" << this->Name()
		<< "\" featureID=\"" << nID;
	if (nID > 0xFFFFFF)
	{
		// Output string format as well.

		char rgch[5];
		rgch[4] = 0;
		rgch[3] = (char)(nID & 0x000000FF);
		rgch[2] = (char)((nID & 0x0000FF00) >> 8);
		rgch[1] = (char)((nID & 0x00FF0000) >> 16);
		rgch[0] = (char)((nID & 0xFF000000) >> 24);
		std::string staT(rgch);

		// Why doesn't this work??
		//union {
		//	char rgch[4];
		//	unsigned int n;
		//} featid;
		//featid.n = nID;
		//// Reverse them.
		//char chTmp = featid.rgch[0];
		//featid.rgch[0] = featid.rgch[4];
		//featid.rgch[4] = chTmp;
		//chTmp = featid.rgch[2];
		//featid.rgch[2] = featid.rgch[3];
		//featid.rgch[3] = chTmp;
		//std::string staT(featid.rgch);
		
		strmOut << "\" featureIDstring=\"" << staT;
	}
	strmOut << "\" index=\"" << this->InternalID();

	if (!lnf.NotSet() && this->ID() != kfidStdLang)
		strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
			<< "\" atLine=\"" << lnf.OriginalLine();

	strmOut << "\" >\n";

	for (unsigned int ifset = 0; ifset < m_vpfset.size(); ifset++)
	{
		m_vpfset[ifset]->DebugXmlFeatures(strmOut, staPathToCur);
	}

	strmOut << "    </feature>\n";
}